

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

void __thiscall Board::randomize(Board *this,int player_number)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  iterator __position;
  Card CVar3;
  pointer pCVar4;
  pointer pCVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  mapped_type *ppvVar9;
  _Base_ptr p_Var10;
  vector<Card,std::allocator<Card>> *pvVar11;
  _Rb_tree_header *p_Var12;
  int iVar13;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>,_std::_Rb_tree_iterator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
  pVar14;
  Card card;
  vector<Card,_std::allocator<Card>_> deck;
  Hand hand;
  Card local_90;
  vector<Card,_std::allocator<Card>_> local_88;
  int local_64;
  void *local_60;
  vector<Card,std::allocator<Card>> *local_58;
  vector<Card,_std::allocator<Card>_> local_48;
  
  local_88.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data._M_start
       = (Card *)0x0;
  local_88.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data._M_finish
       = (Card *)0x0;
  local_88.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->m_player_hands)._M_t._M_impl.super__Rb_tree_header;
  iVar13 = 1;
  do {
    do {
      if (iVar13 != player_number) {
        local_90.m_suit = iVar13;
        ppvVar9 = std::
                  map<int,_std::vector<Card,_std::allocator<Card>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
                  ::operator[](&this->m_player_hands,&local_90.m_suit);
        std::vector<Card,_std::allocator<Card>_>::vector
                  ((vector<Card,_std::allocator<Card>_> *)&local_60,*ppvVar9);
        local_90.m_suit = iVar13;
        pVar14 = std::
                 _Rb_tree<int,_std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>,_std::_Select1st<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
                 ::equal_range((_Rb_tree<int,_std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>,_std::_Select1st<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
                                *)this,&local_90.m_suit);
        std::
        _Rb_tree<int,_std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>,_std::_Select1st<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
        ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>,_std::_Select1st<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
                        *)this,(_Base_ptr)pVar14.first._M_node,(_Base_ptr)pVar14.second._M_node);
        std::vector<Card,std::allocator<Card>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>>
                  ((vector<Card,std::allocator<Card>> *)&local_88,
                   local_88.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                   super__Vector_impl_data._M_finish,local_60,local_58);
        if (local_60 != (void *)0x0) {
          operator_delete(local_60);
        }
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 != 5);
    std::vector<Card,_std::allocator<Card>_>::vector(&local_48,&local_88);
    uVar7 = std::chrono::_V2::system_clock::now();
    local_60 = (void *)((ulong)uVar7 % 0x7fffffff + (ulong)((ulong)uVar7 % 0x7fffffff == 0));
    std::
    shuffle<__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
              ((__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>)
               local_48.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>)
               local_48.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&local_60);
    local_88.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_48.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_88.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_48.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                super__Vector_impl_data._M_finish;
    pCVar5 = local_48.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar4 = local_88.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_48.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
    _M_start = (Card *)0x0;
    local_48.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
    _M_finish = (Card *)0x0;
    local_48.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_88.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
    _M_start = pCVar5;
    if (pCVar4 != (Card *)0x0) {
      operator_delete(pCVar4);
    }
    if (local_48.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
        _M_start != (Card *)0x0) {
      operator_delete(local_48.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_88.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_88.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      iVar13 = 1;
      if (this->m_current_trick != (Trick *)0x0) {
        iVar13 = this->m_player_to_move;
      }
      do {
        if (iVar13 != player_number) {
          iVar8 = Card::get_suit(local_88.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                                 super__Vector_impl_data._M_finish + -1);
          local_60._0_4_ = iVar8;
          local_64 = Card::get_rank(local_88.super__Vector_base<Card,_std::allocator<Card>_>._M_impl
                                    .super__Vector_impl_data._M_finish + -1);
          Card::Card(&local_90,(int *)&local_60,&local_64);
          local_88.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_88.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                      super__Vector_impl_data._M_finish + -1;
          p_Var2 = (this->m_player_hands)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var10 = &p_Var1->_M_header;
          for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
              p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < iVar13]) {
            if (iVar13 <= (int)*(size_t *)(p_Var2 + 1)) {
              p_Var10 = p_Var2;
            }
          }
          p_Var12 = p_Var1;
          if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
             (p_Var12 = (_Rb_tree_header *)p_Var10,
             iVar13 < (int)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
            p_Var12 = p_Var1;
          }
          if (p_Var12 == p_Var1) {
            pvVar11 = (vector<Card,std::allocator<Card>> *)operator_new(0x18);
            *(undefined8 *)pvVar11 = 0;
            *(undefined8 *)(pvVar11 + 8) = 0;
            *(undefined8 *)(pvVar11 + 0x10) = 0;
            if (*(undefined8 **)(pvVar11 + 8) == (undefined8 *)0x0) {
              std::vector<Card,std::allocator<Card>>::_M_realloc_insert<Card_const&>
                        (pvVar11,(iterator)0x0,&local_90);
            }
            else {
              **(undefined8 **)(pvVar11 + 8) = CONCAT44(local_90.m_rank,local_90.m_suit);
              *(long *)(pvVar11 + 8) = *(long *)(pvVar11 + 8) + 8;
            }
            local_60 = (void *)CONCAT44(local_60._4_4_,iVar13);
            local_58 = pvVar11;
            std::
            _Rb_tree<int,std::pair<int_const,std::vector<Card,std::allocator<Card>>*>,std::_Select1st<std::pair<int_const,std::vector<Card,std::allocator<Card>>*>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<Card,std::allocator<Card>>*>>>
            ::_M_emplace_unique<std::pair<int,std::vector<Card,std::allocator<Card>>*>>
                      ((_Rb_tree<int,std::pair<int_const,std::vector<Card,std::allocator<Card>>*>,std::_Select1st<std::pair<int_const,std::vector<Card,std::allocator<Card>>*>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<Card,std::allocator<Card>>*>>>
                        *)this,(pair<int,_std::vector<Card,_std::allocator<Card>_>_*> *)&local_60);
          }
          else {
            local_60 = (void *)CONCAT44(local_60._4_4_,iVar13);
            ppvVar9 = std::
                      map<int,_std::vector<Card,_std::allocator<Card>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
                      ::operator[](&this->m_player_hands,(key_type *)&local_60);
            pvVar11 = (vector<Card,std::allocator<Card>> *)*ppvVar9;
            __position._M_current = *(Card **)(pvVar11 + 8);
            if (__position._M_current == *(Card **)(pvVar11 + 0x10)) {
              std::vector<Card,std::allocator<Card>>::_M_realloc_insert<Card_const&>
                        (pvVar11,__position,&local_90);
            }
            else {
              CVar3.m_rank = local_90.m_rank;
              CVar3.m_suit = local_90.m_suit;
              *__position._M_current = CVar3;
              *(long *)(pvVar11 + 8) = *(long *)(pvVar11 + 8) + 8;
            }
          }
        }
        iVar13 = iVar13 % 4 + 1;
      } while (local_88.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
               super__Vector_impl_data._M_finish !=
               local_88.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
               super__Vector_impl_data._M_start);
    }
    bVar6 = suited_capabilities_met(this);
    iVar13 = 1;
  } while (!bVar6);
  if (local_88.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
      _M_start != (Card *)0x0) {
    operator_delete(local_88.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Board::randomize(int player_number)
{
    std::vector<Card> deck;
    do {
        for (unsigned int i(1); i < 5; ++i) // get all the unknown cards, ie the players hands
        {
            if(i != player_number) {
                Hand hand = *m_player_hands[i];
                m_player_hands.erase(i);
                deck.insert(deck.end(), hand.begin(), hand.end());
            }
        }
        deck = shuffle_cards(deck);

        unsigned int current_player_number = 1; // TODO better nomenclature, conflicts with param
        if(m_current_trick != NULL) {
            // People who've already played in trick will be down cards.
            // Dealing from this player means always have same number of cards after trick
            current_player_number = m_player_to_move;
        }
        while ( deck.size() != 0 )
        {
            if(current_player_number != player_number) {
                // TODO get subset of deck that is equal to cards that player_number could possibly have -> suit caps
                // Shuffle and return random card
                Card card(deck.back().get_suit(), deck.back().get_rank());
                deck.pop_back();

                if (m_player_hands.count(current_player_number) == 1) { // if value exists for key
                    m_player_hands[current_player_number]->push_back(card);
                }
                else{
                    Hand* newHand = new Hand();
                    newHand->push_back(card);
                    m_player_hands.insert(std::pair<int, Hand*>(current_player_number, newHand));
                }
            }
            current_player_number = get_next_player(current_player_number);
        }
    }
    while( suited_capabilities_met() == false );
}